

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

Cord __thiscall google::protobuf::io::CordOutputStream::Consume(CordOutputStream *this)

{
  undefined8 extraout_RDX;
  long in_RSI;
  Cord CVar1;
  CordBuffer local_28;
  CordOutputStream *this_local;
  
  this_local = this;
  absl::lts_20240722::CordBuffer::CordBuffer(&local_28,(CordBuffer *)(in_RSI + 0x28));
  absl::lts_20240722::Cord::Append((Cord *)(in_RSI + 8),&local_28);
  absl::lts_20240722::CordBuffer::~CordBuffer(&local_28);
  *(undefined4 *)(in_RSI + 0x20) = 0;
  absl::lts_20240722::Cord::Cord((Cord *)this,(Cord *)(in_RSI + 8));
  CVar1.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)extraout_RDX;
  CVar1.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar1.contents_.data_.rep_.field_0;
}

Assistant:

absl::Cord CordOutputStream::Consume() {
  cord_.Append(std::move(buffer_));
  state_ = State::kEmpty;
  return std::move(cord_);
}